

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86JMP(uchar *stream,uint labelID,bool isNear)

{
  undefined3 in_register_00000011;
  UnsatisfiedJump local_18;
  
  *stream = !isNear * '\x02' | 0xe9;
  local_18.labelID = labelID & 0x7fffffff;
  local_18.isNear = isNear;
  local_18.jmpPos = stream;
  FastVector<UnsatisfiedJump,_false,_false>::push_back(&pendingJumps,&local_18);
  return CONCAT31(in_register_00000011,isNear) * 3 + 2;
}

Assistant:

int x86JMP(unsigned char *stream, unsigned int labelID, bool isNear)
{
	labelID &= 0x7FFFFFFF;

	if(isNear)
		stream[0] = 0xE9;
	else
		stream[0] = 0xEB;

	pendingJumps.push_back(UnsatisfiedJump(labelID, isNear, stream));
	return (isNear ? 5 : 2);
}